

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalUpdateExtensions::GetData
          (PhysicalUpdateExtensions *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ulong uVar1;
  size_type sVar2;
  DataChunk *in_RDX;
  idx_t col;
  value_type *entry;
  idx_t count;
  UpdateExtensionsGlobalState *data;
  Value *in_stack_fffffffffffffcf8;
  GlobalSourceState *in_stack_fffffffffffffd00;
  idx_t iVar3;
  undefined6 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  DataChunk *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd28;
  ExtensionUpdateResultTag value;
  string *in_stack_fffffffffffffd78;
  Value *in_stack_fffffffffffffd80;
  string local_238 [96];
  string local_1d8 [96];
  string local_178 [96];
  string local_118 [112];
  string local_a8 [96];
  string *local_48;
  reference local_40;
  Value *local_38;
  UpdateExtensionsGlobalState *local_30;
  DataChunk *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  local_30 = GlobalSourceState::Cast<duckdb::UpdateExtensionsGlobalState>(in_stack_fffffffffffffd00)
  ;
  uVar1 = local_30->offset;
  sVar2 = ::std::
          vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
          size(&(local_30->update_result_entries).
                super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
              );
  if (uVar1 < sVar2) {
    local_38 = (Value *)0x0;
    while( true ) {
      value = (ExtensionUpdateResultTag)((ulong)in_stack_fffffffffffffd28 >> 0x38);
      uVar1 = local_30->offset;
      sVar2 = ::std::
              vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
              ::size(&(local_30->update_result_entries).
                      super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
                    );
      if (sVar2 <= uVar1 || (Value *)0x7ff < local_38) break;
      local_40 = vector<duckdb::ExtensionUpdateResult,_true>::operator[]
                           ((vector<duckdb::ExtensionUpdateResult,_true> *)in_stack_fffffffffffffd00
                            ,(size_type)in_stack_fffffffffffffcf8);
      local_48 = (string *)0x1;
      ::std::__cxx11::string::string(local_a8,(string *)&local_40->extension_name);
      Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      DataChunk::SetValue(in_stack_fffffffffffffd10,
                          CONCAT17(in_stack_fffffffffffffd0f,
                                   CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                          (idx_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Value::~Value((Value *)in_stack_fffffffffffffd00);
      ::std::__cxx11::string::~string(local_a8);
      in_stack_fffffffffffffd78 = local_48;
      in_stack_fffffffffffffd80 = local_38;
      local_48 = (string *)&local_48->field_0x1;
      ::std::__cxx11::string::string(local_118,(string *)&local_40->repository);
      Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      DataChunk::SetValue(in_stack_fffffffffffffd10,
                          CONCAT17(in_stack_fffffffffffffd0f,
                                   CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                          (idx_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Value::~Value((Value *)in_stack_fffffffffffffd00);
      ::std::__cxx11::string::~string(local_118);
      local_48 = (string *)((long)local_48 + 1);
      EnumUtil::ToString<duckdb::ExtensionUpdateResultTag>(value);
      Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      DataChunk::SetValue(in_stack_fffffffffffffd10,
                          CONCAT17(in_stack_fffffffffffffd0f,
                                   CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                          (idx_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Value::~Value((Value *)in_stack_fffffffffffffd00);
      ::std::__cxx11::string::~string(local_178);
      local_48 = (string *)((long)local_48 + 1);
      ::std::__cxx11::string::string(local_1d8,(string *)&local_40->prev_version);
      Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      DataChunk::SetValue(in_stack_fffffffffffffd10,
                          CONCAT17(in_stack_fffffffffffffd0f,
                                   CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                          (idx_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Value::~Value((Value *)in_stack_fffffffffffffd00);
      ::std::__cxx11::string::~string(local_1d8);
      local_48 = (string *)((long)local_48 + 1);
      in_stack_fffffffffffffd28 = local_238;
      in_stack_fffffffffffffd10 = local_20;
      ::std::__cxx11::string::string
                (in_stack_fffffffffffffd28,(string *)&local_40->installed_version);
      Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      DataChunk::SetValue(in_stack_fffffffffffffd10,
                          CONCAT17(in_stack_fffffffffffffd0f,
                                   CONCAT16(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08)),
                          (idx_t)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      Value::~Value((Value *)in_stack_fffffffffffffd00);
      ::std::__cxx11::string::~string(local_238);
      local_30->offset = local_30->offset + 1;
      local_38 = (Value *)&(local_38->type_).physical_type_;
    }
    DataChunk::SetCardinality(local_20,(idx_t)local_38);
    iVar3 = local_30->offset;
    sVar2 = ::std::
            vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>::
            size(&(local_30->update_result_entries).
                  super_vector<duckdb::ExtensionUpdateResult,_std::allocator<duckdb::ExtensionUpdateResult>_>
                );
    local_1 = sVar2 <= iVar3;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

SourceResultType PhysicalUpdateExtensions::GetData(ExecutionContext &context, DataChunk &chunk,
                                                   OperatorSourceInput &input) const {
	auto &data = input.global_state.Cast<UpdateExtensionsGlobalState>();

	if (data.offset >= data.update_result_entries.size()) {
		// finished returning values
		return SourceResultType::FINISHED;
	}

	idx_t count = 0;
	while (data.offset < data.update_result_entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.update_result_entries[data.offset];

		// return values:
		idx_t col = 0;
		// extension_name LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.extension_name));
		// repository LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.repository));
		// update_result
		chunk.SetValue(col++, count, Value(EnumUtil::ToString(entry.tag)));
		// previous_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.prev_version));
		// current_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.installed_version));

		data.offset++;
		count++;
	}
	chunk.SetCardinality(count);

	return data.offset >= data.update_result_entries.size() ? SourceResultType::FINISHED
	                                                        : SourceResultType::HAVE_MORE_OUTPUT;
}